

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
calc_kurtosis_all_data<InputData<double,int>,double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          InputData<double,_int> *input_data,ModelParams *model_params,Xoshiro256PP *rnd_generator)

{
  int iVar1;
  size_t sVar2;
  double *pdVar3;
  int *Xc_indptr;
  double *pdVar4;
  double *buffer_prob;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  vector<double,_std::allocator<double>_> *__range1;
  ulong uVar8;
  double dVar9;
  allocator_type local_41;
  double *local_40;
  size_t *local_38;
  
  sVar2 = input_data->ncols_categ;
  if (sVar2 == 0) {
    local_38 = (size_t *)0x0;
    buffer_prob = (double *)0x0;
  }
  else {
    iVar1 = input_data->max_categ;
    lVar5 = (long)iVar1;
    uVar7 = lVar5 * 8;
    if (lVar5 < 0) {
      uVar7 = 0xffffffffffffffff;
    }
    buffer_prob = (double *)operator_new__(uVar7);
    local_40 = buffer_prob;
    if ((input_data->sample_weights == (double *)0x0) || (input_data->weight_as_sample == true)) {
      uVar7 = lVar5 * 8 + 8;
      if (iVar1 < -1) {
        uVar7 = 0xffffffffffffffff;
      }
      local_38 = (size_t *)operator_new__(uVar7);
      buffer_prob = local_40;
    }
    else {
      local_38 = (size_t *)0x0;
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,sVar2 + input_data->ncols_numeric,&local_41);
  if (input_data->ncols_tot == 0) {
    uVar7 = 0;
  }
  else {
    uVar8 = 0;
    do {
      uVar7 = input_data->ncols_numeric;
      if (uVar8 < uVar7) {
        pdVar3 = input_data->sample_weights;
        Xc_indptr = input_data->Xc_indptr;
        if (Xc_indptr == (int *)0x0) {
          if ((pdVar3 == (double *)0x0) || (input_data->weight_as_sample == true)) {
            dVar9 = calc_kurtosis<double,double>
                              (input_data->numeric_data + input_data->nrows * uVar8,
                               input_data->nrows,model_params->missing_action);
          }
          else {
            dVar9 = calc_kurtosis_weighted<double,double>
                              (input_data->numeric_data + input_data->nrows * uVar8,
                               input_data->nrows,model_params->missing_action,pdVar3);
          }
        }
        else if ((pdVar3 == (double *)0x0) || (input_data->weight_as_sample == true)) {
          dVar9 = calc_kurtosis<double,int,double>
                            (uVar8,input_data->nrows,input_data->Xc,input_data->Xc_ind,Xc_indptr,
                             model_params->missing_action);
        }
        else {
          dVar9 = calc_kurtosis_weighted<double,int,double>
                            (uVar8,input_data->nrows,input_data->Xc,input_data->Xc_ind,Xc_indptr,
                             model_params->missing_action,pdVar3);
        }
      }
      else if ((input_data->sample_weights == (double *)0x0) ||
              (input_data->weight_as_sample == true)) {
        dVar9 = calc_kurtosis<double>
                          (input_data->nrows,
                           input_data->categ_data + (uVar8 - uVar7) * input_data->nrows,
                           input_data->ncat[uVar8 - uVar7],local_38,buffer_prob,
                           model_params->missing_action,model_params->cat_split_type,rnd_generator);
      }
      else {
        dVar9 = calc_kurtosis_weighted<double,double>
                          (input_data->nrows,
                           input_data->categ_data + (uVar8 - uVar7) * input_data->nrows,
                           input_data->ncat[uVar8 - uVar7],buffer_prob,model_params->missing_action,
                           model_params->cat_split_type,rnd_generator,input_data->sample_weights);
      }
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar8] = dVar9;
      uVar8 = uVar8 + 1;
      uVar7 = input_data->ncols_tot;
    } while (uVar8 < uVar7);
  }
  pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar6 = pdVar3; pdVar6 != pdVar4; pdVar6 = pdVar6 + 1) {
    dVar9 = 0.0;
    if ((-INFINITY < *pdVar6) && (dVar9 = *pdVar6 + -1.0, dVar9 <= 1e-08)) {
      dVar9 = 1e-08;
    }
    *pdVar6 = dVar9;
  }
  pdVar4 = input_data->col_weights;
  if (uVar7 != 0 && pdVar4 != (double *)0x0) {
    uVar8 = 0;
    do {
      if (0.0 < pdVar3[uVar8]) {
        dVar9 = pdVar3[uVar8] * pdVar4[uVar8];
        if (dVar9 <= 1e-100) {
          dVar9 = 1e-100;
        }
        pdVar3[uVar8] = dVar9;
      }
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  if (local_38 != (size_t *)0x0) {
    operator_delete__(local_38);
  }
  if (buffer_prob != (double *)0x0) {
    operator_delete__(buffer_prob);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> calc_kurtosis_all_data(InputData &input_data, ModelParams &model_params, RNG_engine &rnd_generator)
{
    std::unique_ptr<double[]> buffer_double;
    std::unique_ptr<size_t[]> buffer_size_t;
    if (input_data.ncols_categ)
    {
        buffer_double = std::unique_ptr<double[]>(new double[input_data.max_categ]);
        if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            buffer_size_t = std::unique_ptr<size_t[]>(new size_t[input_data.max_categ + 1]);
    }


    std::vector<double> kurt_weights(input_data.ncols_numeric + input_data.ncols_categ);
    for (size_t col = 0; col < input_data.ncols_tot; col++)
    {
        if (col < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr == NULL)
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.numeric_data)>::type, ldouble_safe>(
                                        input_data.numeric_data + col * input_data.nrows,
                                        input_data.nrows, model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                                 ldouble_safe>(
                                                 input_data.numeric_data + col * input_data.nrows, input_data.nrows,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }

            else
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                        typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                        ldouble_safe>(
                                        col, input_data.nrows,
                                        input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                        model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                                 typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                                 ldouble_safe>(
                                                 col, input_data.nrows,
                                                 input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }
        }

        else
        {
            if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            {
                kurt_weights[col]
                        = calc_kurtosis<ldouble_safe>(input_data.nrows,
                                        input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                        input_data.ncat[col - input_data.ncols_numeric],
                                        buffer_size_t.get(), buffer_double.get(),
                                        model_params.missing_action, model_params.cat_split_type, rnd_generator);
            }

            else
            {
                kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.sample_weights)>::type,
                                                 ldouble_safe>(
                                                 input_data.nrows,
                                                 input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                                 input_data.ncat[col - input_data.ncols_numeric],
                                                 buffer_double.get(),
                                                 model_params.missing_action, model_params.cat_split_type,
                                                 rnd_generator, input_data.sample_weights);
            }
        }
    }

    for (auto &w : kurt_weights) w = (w == -HUGE_VAL)? 0. : std::fmax(1e-8, -1. + w);
    if (input_data.col_weights != NULL)
    {
        for (size_t col = 0; col < input_data.ncols_tot; col++)
        {
            if (kurt_weights[col] <= 0) continue;
            kurt_weights[col] *= input_data.col_weights[col];
            kurt_weights[col] = std::fmax(kurt_weights[col], 1e-100);
        }
    }

    return kurt_weights;
}